

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

char * __thiscall
CClient::LoadMapSearch(CClient *this,char *pMapName,SHA256_DIGEST *pWantedSha256,int WantedCrc)

{
  SHA256_DIGEST digest;
  uint uVar1;
  char *pcVar2;
  IStorage *pIVar3;
  uint in_ECX;
  SHA256_DIGEST *in_RDX;
  char *in_RSI;
  CClient *in_RDI;
  long in_FS_OFFSET;
  char *pError;
  char aFilename [128];
  char aWantedSha256 [65];
  char aWanted [81];
  char aBuf [512];
  undefined8 in_stack_fffffffffffffc50;
  CClient *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  undefined4 uVar4;
  int iVar5;
  undefined4 in_stack_fffffffffffffc80;
  CClient *pName;
  CClient *in_stack_fffffffffffffca0;
  char local_358 [80];
  undefined1 local_2b8 [80];
  char local_268 [96];
  char local_208 [512];
  long local_8;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_268[0] = '\0';
  pName = in_RDI;
  if (in_RDX != (SHA256_DIGEST *)0x0) {
    pcVar2 = *(char **)(in_RDX->data + 8);
    in_stack_fffffffffffffc58 = *(CClient **)(in_RDX->data + 0x10);
    digest.data._8_4_ = in_stack_fffffffffffffc68;
    digest.data._0_8_ = *(undefined8 *)(in_RDX->data + 0x18);
    digest.data._12_4_ = in_stack_fffffffffffffc6c;
    digest.data._16_8_ = in_RDI;
    digest.data[0x18] = '\0';
    digest.data[0x19] = '\0';
    digest.data[0x1a] = '\0';
    digest.data[0x1b] = '\0';
    digest.data[0x1c] = '\0';
    digest.data[0x1d] = '\0';
    digest.data[0x1e] = '\0';
    digest.data[0x1f] = '\0';
    sha256_str(digest,pcVar2,*(size_t *)in_RDX->data);
    iVar5 = (int)((ulong)pcVar2 >> 0x20);
    str_format(local_268,0x51,"sha256=%s ",local_2b8);
  }
  str_format(local_208,0x200,"loading map, map=%s wanted %scrc=%08x",in_RSI,local_268,(ulong)in_ECX)
  ;
  (*(in_RDI->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
            (in_RDI->m_pConsole,1,"client",local_208,0);
  SetState(in_stack_fffffffffffffc58,iVar5);
  str_format(local_208,0x200,"maps/%s.map",in_RSI);
  pcVar2 = LoadMap(in_stack_fffffffffffffca0,(char *)pName,in_RSI,in_RDX,in_ECX);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    FormatMapDownloadFilename
              ((char *)in_RDX,(SHA256_DIGEST *)CONCAT44(in_ECX,in_stack_fffffffffffffc80),
               (int)((ulong)pcVar2 >> 0x20),SUB81((ulong)pcVar2 >> 0x18,0),(char *)in_RDI,
               in_stack_fffffffffffffc6c);
    pcVar2 = LoadMap(in_stack_fffffffffffffca0,(char *)pName,in_RSI,in_RDX,in_ECX);
    uVar4 = SUB84(pcVar2,0);
    iVar5 = (int)((ulong)pcVar2 >> 0x20);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      if (in_RDX != (SHA256_DIGEST *)0x0) {
        FormatMapDownloadFilename
                  ((char *)in_RDX,(SHA256_DIGEST *)CONCAT44(in_ECX,in_stack_fffffffffffffc80),iVar5,
                   SUB81((ulong)pcVar2 >> 0x18,0),(char *)in_RDI,in_stack_fffffffffffffc6c);
        pcVar2 = LoadMap(in_stack_fffffffffffffca0,(char *)pName,in_RSI,in_RDX,in_ECX);
        uVar4 = SUB84(pcVar2,0);
        iVar5 = (int)((ulong)pcVar2 >> 0x20);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = (char *)0x0;
          goto LAB_0012219c;
        }
      }
      str_format(local_358,0x80,"%s.map",in_RSI);
      pIVar3 = Storage(in_RDI);
      uVar1 = (*(pIVar3->super_IInterface)._vptr_IInterface[7])
                        (pIVar3,local_358,"maps",0xffffffff,local_208,0x200);
      if ((uVar1 & 1) != 0) {
        pcVar2 = LoadMap(in_stack_fffffffffffffca0,(char *)pName,in_RSI,in_RDX,in_ECX);
        uVar4 = SUB84(pcVar2,0);
        iVar5 = (int)((ulong)pcVar2 >> 0x20);
      }
      pcVar2 = (char *)CONCAT44(iVar5,uVar4);
    }
  }
LAB_0012219c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pcVar2;
}

Assistant:

const char *CClient::LoadMapSearch(const char *pMapName, const SHA256_DIGEST *pWantedSha256, int WantedCrc)
{
	const char *pError = 0;
	char aBuf[512];
	char aWanted[SHA256_MAXSTRSIZE + 16];
	aWanted[0] = 0;
	if(pWantedSha256)
	{
		char aWantedSha256[SHA256_MAXSTRSIZE];
		sha256_str(*pWantedSha256, aWantedSha256, sizeof(aWantedSha256));
		str_format(aWanted, sizeof(aWanted), "sha256=%s ", aWantedSha256);
	}
	str_format(aBuf, sizeof(aBuf), "loading map, map=%s wanted %scrc=%08x", pMapName, aWanted, WantedCrc);
	m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client", aBuf);
	SetState(IClient::STATE_LOADING);

	// try the normal maps folder
	str_format(aBuf, sizeof(aBuf), "maps/%s.map", pMapName);
	pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);
	if(!pError)
		return pError;

	// try the downloaded maps
	FormatMapDownloadFilename(pMapName, pWantedSha256, WantedCrc, false, aBuf, sizeof(aBuf));
	pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);
	if(!pError)
		return pError;

	// backward compatibility with old names
	if(pWantedSha256)
	{
		FormatMapDownloadFilename(pMapName, 0, WantedCrc, false, aBuf, sizeof(aBuf));
		pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);
		if(!pError)
			return pError;
	}

	// search for the map within subfolders
	char aFilename[128];
	str_format(aFilename, sizeof(aFilename), "%s.map", pMapName);
	if(Storage()->FindFile(aFilename, "maps", IStorage::TYPE_ALL, aBuf, sizeof(aBuf)))
		pError = LoadMap(pMapName, aBuf, pWantedSha256, WantedCrc);

	return pError;
}